

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O2

double __thiscall re2::trunc_abi_cxx11_(re2 *this,double __x)

{
  StringPiece *in_RSI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar1;
  allocator<char> local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  StringPiece local_20;
  
  if (in_RSI->size_ < 100) {
    std::__cxx11::string::string<re2::StringPiece,void>
              ((string *)this,in_RSI,(allocator<char> *)&local_40);
    dVar1 = extraout_XMM0_Qa;
  }
  else {
    local_20 = StringPiece::substr(in_RSI,0,100);
    std::__cxx11::string::string<re2::StringPiece,void>((string *)&local_40,&local_20,&local_41);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   &local_40,"...");
    std::__cxx11::string::~string((string *)&local_40);
    dVar1 = extraout_XMM0_Qa_00;
  }
  return dVar1;
}

Assistant:

static std::string trunc(const StringPiece& pattern) {
  if (pattern.size() < 100)
    return std::string(pattern);
  return std::string(pattern.substr(0, 100)) + "...";
}